

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_ATC_NAVAIDS_FundamentalParameterData.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,IFF_ATC_NAVAIDS_FundamentalParameterData *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"IFF/ATC/NAVAID Fundamental Parameter Data:",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tERP:              ",0x14);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32ERP);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tFrequency:        ",0x14);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32Freq);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tPgRF:             ",0x14);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32PgRF);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tPulse Width:      ",0x14);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32PulseWidth);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tBurst Length:     ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tApplicable Modes: ",0x14);
  ENUMS::GetEnumAsStringSystemMode_abi_cxx11_(&local_1c0,(ENUMS *)(ulong)this->m_ui8AppMode,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString IFF_ATC_NAVAIDS_FundamentalParameterData::GetAsString() const
{
    KStringStream ss;

    ss << "IFF/ATC/NAVAID Fundamental Parameter Data:"
       << "\n\tERP:              " << m_f32ERP
       << "\n\tFrequency:        " << m_f32Freq
       << "\n\tPgRF:             " << m_f32PgRF
       << "\n\tPulse Width:      " << m_f32PulseWidth
       << "\n\tBurst Length:     " << m_ui32BurstLength
       << "\n\tApplicable Modes: " << GetEnumAsStringSystemMode( m_ui8AppMode )
       << "\n";

    return ss.str();
}